

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O0

bool Minisat::match<char*>(char **in,char *str)

{
  int local_24;
  int i;
  char *str_local;
  char **in_local;
  
  local_24 = 0;
  while( true ) {
    if (str[local_24] == '\0') {
      *in = *in + local_24;
      return true;
    }
    if ((*in)[local_24] != str[local_24]) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

static bool match(B& in, const char* str) {
    int i;
    for (i = 0; str[i] != '\0'; i++)
        if (in[i] != str[i])
            return false;

    in += i;

    return true; 
}